

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t sVar4;
  size_t deflatesize;
  uchar *deflatedata;
  
  deflatedata = (uchar *)0x0;
  deflatesize = 0;
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_deflate(&deflatedata,&deflatesize,in,insize,settings);
  }
  else {
    uVar1 = (*settings->custom_deflate)(&deflatedata,&deflatesize,in,insize,settings);
  }
  sVar4 = deflatesize;
  *out = (uchar *)0x0;
  *outsize = 0;
  if (uVar1 == 0) {
    *outsize = deflatesize + 6;
    puVar2 = (uchar *)malloc(deflatesize + 6);
    *out = puVar2;
    if (puVar2 == (uchar *)0x0) {
      uVar1 = 0x53;
    }
    else {
      uVar1 = adler32(in,(uint)insize);
      puVar2[0] = 'x';
      puVar2[1] = '\x01';
      for (sVar3 = 0; sVar3 != sVar4; sVar3 = sVar3 + 1) {
        (*out)[sVar3 + 2] = deflatedata[sVar3];
        sVar4 = deflatesize;
      }
      *(uint *)(*out + (*outsize - 4)) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = 0;
    }
  }
  free(deflatedata);
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
  size_t insize, const LodePNGCompressSettings* settings) {
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  *out = NULL;
  *outsize = 0;
  if (!error) {
    *outsize = deflatesize + 6;
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if (!*out) error = 83; /*alloc fail*/
  }

  if (!error) {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
    unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
    unsigned FLEVEL = 0;
    unsigned FDICT = 0;
    unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
    unsigned FCHECK = 31 - CMFFLG % 31;
    CMFFLG += FCHECK;

    (*out)[0] = (unsigned char)(CMFFLG >> 8);
    (*out)[1] = (unsigned char)(CMFFLG & 255);
    for (i = 0; i != deflatesize; ++i) (*out)[i + 2] = deflatedata[i];
    lodepng_set32bitInt(&(*out)[*outsize - 4], ADLER32);
  }

  lodepng_free(deflatedata);
  return error;
}